

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenRefI31(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  RefI31 *pRVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pRVar1 = wasm::Builder::makeRefI31(&local_10,value,Unshared);
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenRefI31(BinaryenModuleRef module,
                                     BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefI31((Expression*)value));
}